

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O0

void __thiscall ddd::DictionaryMLT<false,_false>::DictionaryMLT(DictionaryMLT<false,_false> *this)

{
  Dictionary *in_RDI;
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  *puVar1;
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  *in_stack_ffffffffffffffd0;
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  *this_00;
  
  Dictionary::Dictionary(in_RDI);
  in_RDI->_vptr_Dictionary = (_func_int **)&PTR__DictionaryMLT_001a2968;
  puVar1 = (unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
            *)(in_RDI + 1);
  std::unique_ptr<ddd::DaTrie<false,false,true>,std::default_delete<ddd::DaTrie<false,false,true>>>
  ::unique_ptr<std::default_delete<ddd::DaTrie<false,false,true>>,void>(in_stack_ffffffffffffffd0);
  this_00 = (unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
             *)(in_RDI + 2);
  in_RDI[2]._vptr_Dictionary = (_func_int **)0x0;
  in_RDI[3]._vptr_Dictionary = (_func_int **)0x0;
  in_RDI[4]._vptr_Dictionary = (_func_int **)0x0;
  std::
  vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
  ::vector((vector<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
            *)0x16a0d9);
  *(undefined4 *)&in_RDI[5]._vptr_Dictionary = 0xffffffff;
  in_RDI[6]._vptr_Dictionary = (_func_int **)0x0;
  make_unique<ddd::DaTrie<false,false,true>>();
  std::
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  ::operator=(this_00,puVar1);
  std::
  unique_ptr<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
  ::~unique_ptr(this_00);
  return;
}

Assistant:

DictionaryMLT() {
    prefix_subtrie_ = make_unique<PrefixTrieType>();
  }